

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

LexToken lex_scan(LexState *ls,TValue *tv)

{
  LexChar LVar1;
  LexToken LVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  GCstr *pGVar6;
  SBuf *pSVar7;
  undefined4 *in_RSI;
  LexState *in_RDI;
  bool bVar8;
  LexChar c;
  int sep_1;
  int sep;
  GCstr *s;
  char *p;
  char *p_1;
  MSize in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint local_1f8;
  uint local_1f4;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  uint local_1d8;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  LexState *in_stack_fffffffffffffe38;
  int local_1ac;
  LexState *pLVar9;
  char *local_20;
  char *local_8;
  
  (in_RDI->sb).p.ptr32 = (in_RDI->sb).b.ptr32;
  do {
    if ((""[(long)in_RDI->c + 1] & 0x80) != 0) {
      if ((""[(long)in_RDI->c + 1] & 8) == 0) {
        do {
          LVar1 = in_RDI->c;
          pSVar7 = &in_RDI->sb;
          if ((in_RDI->sb).e.ptr32 == (pSVar7->p).ptr32) {
            local_8 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffdd4,
                                                    in_stack_fffffffffffffdd0),
                                   in_stack_fffffffffffffdcc);
          }
          else {
            local_8 = (char *)(ulong)(pSVar7->p).ptr32;
          }
          *local_8 = (char)LVar1;
          (pSVar7->p).ptr32 = (int)local_8 + 1;
          if (in_RDI->p < in_RDI->pe) {
            pbVar3 = (byte *)in_RDI->p;
            in_RDI->p = (char *)(pbVar3 + 1);
            local_1d8 = (uint)*pbVar3;
          }
          else {
            local_1d8 = lex_more((LexState *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          }
          in_RDI->c = local_1d8;
        } while ((""[(long)in_RDI->c + 1] & 0x80) != 0);
        pGVar6 = lj_parse_keepstr((LexState *)
                                  CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                  (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),
                                  CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        *in_RSI = (int)pGVar6;
        in_RSI[1] = 0xfffffffb;
        if (pGVar6->reserved == '\0') {
          local_1ac = 0x11f;
        }
        else {
          local_1ac = pGVar6->reserved + 0x100;
        }
      }
      else {
        lex_number((LexState *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (TValue *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        local_1ac = 0x11e;
      }
      return local_1ac;
    }
    switch(in_RDI->c) {
    default:
      LVar2 = in_RDI->c;
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return LVar2;
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        local_1e4 = (uint)*pbVar3;
      }
      else {
        local_1e4 = lex_more((LexState *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = local_1e4;
      break;
    case 10:
    case 0xd:
      lex_newline((LexState *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      break;
    case 0x22:
    case 0x27:
      lex_string(in_stack_fffffffffffffe38,
                 (TValue *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      return 0x120;
    case 0x2d:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        local_1e8 = (uint)*pbVar3;
      }
      else {
        local_1e8 = lex_more((LexState *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = local_1e8;
      if (in_RDI->c != 0x2d) {
        return 0x2d;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        local_1ec = (uint)*pbVar3;
      }
      else {
        local_1ec = lex_more((LexState *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = local_1ec;
      if (in_RDI->c == 0x5b) {
        in_stack_fffffffffffffe34 =
             lex_skipeq((LexState *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        (in_RDI->sb).p.ptr32 = (in_RDI->sb).b.ptr32;
        if (in_stack_fffffffffffffe34 < 0) goto LAB_0014b3d5;
        lex_longstring((LexState *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (TValue *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       in_stack_fffffffffffffde4);
        (in_RDI->sb).p.ptr32 = (in_RDI->sb).b.ptr32;
      }
      else {
LAB_0014b3d5:
        while( true ) {
          bVar8 = false;
          if ((in_RDI->c != 10) && (bVar8 = false, in_RDI->c != 0xd)) {
            bVar8 = in_RDI->c != -1;
          }
          if (!bVar8) break;
          if (in_RDI->p < in_RDI->pe) {
            pbVar3 = (byte *)in_RDI->p;
            in_RDI->p = (char *)(pbVar3 + 1);
            local_1f4 = (uint)*pbVar3;
          }
          else {
            local_1f4 = lex_more((LexState *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          }
          in_RDI->c = local_1f4;
        }
      }
      break;
    case 0x2e:
      LVar1 = in_RDI->c;
      pSVar7 = &in_RDI->sb;
      if ((in_RDI->sb).e.ptr32 == (pSVar7->p).ptr32) {
        local_20 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0
                                                ),in_stack_fffffffffffffdcc);
      }
      else {
        local_20 = (char *)(ulong)(pSVar7->p).ptr32;
      }
      *local_20 = (char)LVar1;
      (pSVar7->p).ptr32 = (int)local_20 + 1;
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      if (uVar5 == 0x2e) {
        if (in_RDI->p < in_RDI->pe) {
          pbVar3 = (byte *)in_RDI->p;
          in_RDI->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        else {
          uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                          );
        }
        in_RDI->c = uVar5;
        if (in_RDI->c == 0x2e) {
          if (in_RDI->p < in_RDI->pe) {
            pbVar3 = (byte *)in_RDI->p;
            in_RDI->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          else {
            uVar5 = lex_more((LexState *)CONCAT44(uVar5,in_stack_fffffffffffffdd8));
          }
          in_RDI->c = uVar5;
          return 0x118;
        }
        return 0x117;
      }
      if ((""[(long)in_RDI->c + 1] & 8) == 0) {
        return 0x2e;
      }
      lex_number((LexState *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (TValue *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      return 0x11e;
    case 0x3a:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      if (in_RDI->c != 0x3a) {
        return 0x3a;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return 0x11d;
    case 0x3c:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      if (in_RDI->c != 0x3d) {
        return 0x3c;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return 0x11b;
    case 0x3d:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        local_1f8 = (uint)*pbVar3;
      }
      else {
        local_1f8 = lex_more((LexState *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = local_1f8;
      if (in_RDI->c != 0x3d) {
        return 0x3d;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return 0x119;
    case 0x3e:
      pLVar9 = in_RDI;
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      pLVar9->c = uVar5;
      if (in_RDI->c != 0x3d) {
        return 0x3e;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return 0x11a;
    case 0x5b:
      iVar4 = lex_skipeq((LexState *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      if (-1 < iVar4) {
        lex_longstring((LexState *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (TValue *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       in_stack_fffffffffffffde4);
        return 0x120;
      }
      if (iVar4 == -1) {
        return 0x5b;
      }
      lj_lex_error(in_RDI,0x120,LJ_ERR_XLDELIM);
    case 0x7e:
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      if (in_RDI->c != 0x3d) {
        return 0x7e;
      }
      if (in_RDI->p < in_RDI->pe) {
        pbVar3 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      else {
        uVar5 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      in_RDI->c = uVar5;
      return 0x11c;
    case -1:
      return 0x121;
    }
  } while( true );
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, sbufB(&ls->sb), sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}